

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall sznet::net::Buffer::ensureWritableBytes(Buffer *this,size_t len)

{
  if ((ulong)((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + this->m_writerIndex)) < len) {
    makeSpace(this,len);
  }
  if (len <= (ulong)((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + this->m_writerIndex))) {
    return;
  }
  __assert_fail("writableBytes() >= len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0xc6,"void sznet::net::Buffer::ensureWritableBytes(size_t)");
}

Assistant:

void ensureWritableBytes(size_t len)
	{
		if (writableBytes() < len)
		{
			makeSpace(len);
		}
		assert(writableBytes() >= len);
	}